

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixUtils.cpp
# Opt level: O3

set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
* getEigenSpaceBasis(set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
                     *__return_storage_ptr__,RationalNum **matrix,uint size,RationalNum eigenValue)

{
  _Rb_tree_color _Var1;
  void *pvVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  RationalNum **matrix_00;
  RationalNum *pRVar5;
  RationalNum **ppRVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  ulong uVar9;
  _Rb_tree_color _Var10;
  ulong uVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  ulong uVar14;
  ulong uVar15;
  _Rb_tree_header *p_Var16;
  ulong __n;
  set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
  *basis;
  vector<RationalNum,_std::allocator<RationalNum>_> basisVector;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> basisFields;
  vector<RationalNum,_std::allocator<RationalNum>_> local_b8;
  ulong local_a0;
  RationalNum local_98;
  ulong local_88;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_80;
  RationalNum local_50;
  RationalNum local_40;
  
  local_40.denominator = eigenValue.denominator;
  local_40.numerator = eigenValue.numerator;
  __n = (ulong)size;
  matrix_00 = (RationalNum **)operator_new__(__n * 8);
  if (size != 0) {
    uVar9 = __n << 4;
    uVar14 = 0;
    do {
      pRVar5 = (RationalNum *)operator_new__(uVar9);
      uVar11 = 0;
      do {
        RationalNum::RationalNum((RationalNum *)((long)&pRVar5->numerator + uVar11));
        uVar11 = uVar11 + 0x10;
      } while (uVar9 != uVar11);
      matrix_00[uVar14] = pRVar5;
      uVar11 = 0;
      do {
        RationalNum::operator=
                  ((RationalNum *)((long)&pRVar5->numerator + uVar11),
                   (RationalNum *)((long)&matrix[uVar14]->numerator + uVar11));
        uVar11 = uVar11 + 0x10;
      } while (uVar9 != uVar11);
      uVar14 = uVar14 + 1;
    } while (uVar14 != __n);
    if (size != 0) {
      uVar14 = 0;
      ppRVar6 = matrix_00;
      do {
        RationalNum::operator-=((RationalNum *)((long)&(*ppRVar6)->numerator + uVar14),&local_40);
        uVar14 = uVar14 + 0x10;
        ppRVar6 = ppRVar6 + 1;
      } while (uVar9 != uVar14);
    }
  }
  ppRVar6 = getGaussForm(matrix_00,size);
  p_Var16 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var16->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var16->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  if (size != 0) {
    uVar9 = 0;
    do {
      pRVar5 = ppRVar6[uVar9];
      uVar14 = 0;
      do {
        RationalNum::RationalNum((RationalNum *)&local_b8,0,1);
        bVar4 = operator!=(pRVar5,(RationalNum *)&local_b8);
        if (bVar4) {
          local_b8.super__Vector_base<RationalNum,_std::allocator<RationalNum>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = (undefined4)uVar14;
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::_M_insert_unique<unsigned_int>(&local_80,(uint *)&local_b8);
          break;
        }
        uVar14 = uVar14 + 1;
        pRVar5 = pRVar5 + 1;
      } while (__n != uVar14);
      uVar9 = uVar9 + 1;
    } while (uVar9 != __n);
    if (size != 0) {
      uVar9 = 0;
      do {
        p_Var16 = &local_80._M_impl.super__Rb_tree_header;
        p_Var12 = &p_Var16->_M_header;
        p_Var3 = local_80._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (local_80._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_001156cf:
          std::vector<RationalNum,_std::allocator<RationalNum>_>::vector
                    (&local_b8,__n,(allocator_type *)&local_98);
          RationalNum::RationalNum(&local_98,1,1);
          RationalNum::operator=
                    ((RationalNum *)
                     (uVar9 * 0x10 +
                     CONCAT44(local_b8.super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_b8.super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_4_)),&local_98);
          uVar14 = 0;
          local_a0 = uVar9;
          do {
            pRVar5 = ppRVar6[~(uint)uVar14 + size];
            uVar9 = 1;
            uVar11 = 0;
LAB_00115725:
            RationalNum::RationalNum(&local_98,0,1);
            bVar4 = operator!=(pRVar5 + uVar11,&local_98);
            if (!bVar4) goto code_r0x0011574a;
            uVar15 = uVar11 & 0xffffffff;
            local_88 = uVar14;
            if ((int)uVar11 + 1U < size) {
              do {
                p_Var12 = &local_80._M_impl.super__Rb_tree_header._M_header;
                p_Var3 = local_80._M_impl.super__Rb_tree_header._M_header._M_parent;
                if (local_80._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                  do {
                    p_Var13 = p_Var3;
                    p_Var8 = p_Var12;
                    _Var1 = p_Var13[1]._M_color;
                    _Var10 = (_Rb_tree_color)uVar11;
                    p_Var7 = p_Var8;
                    if (_Var10 < _Var1) {
                      p_Var7 = p_Var13;
                    }
                    p_Var12 = p_Var7;
                    p_Var3 = (&p_Var13->_M_left)[_Var1 <= _Var10];
                  } while ((&p_Var13->_M_left)[_Var1 <= _Var10] != (_Base_ptr)0x0);
                  p_Var16 = &local_80._M_impl.super__Rb_tree_header;
                  p_Var12 = &p_Var16->_M_header;
                  if ((_Rb_tree_header *)p_Var7 != p_Var16) {
                    if (_Var10 < _Var1) {
                      p_Var8 = p_Var13;
                    }
                    p_Var12 = p_Var7;
                    if (uVar9 < p_Var8[1]._M_color) {
                      p_Var12 = &p_Var16->_M_header;
                    }
                  }
                }
                if ((uVar9 == local_a0) ||
                   ((_Rb_tree_header *)p_Var12 != &local_80._M_impl.super__Rb_tree_header)) {
                  local_98 = operator*((RationalNum *)
                                       (uVar9 * 0x10 +
                                       CONCAT44(local_b8.
                                                super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                local_b8.
                                                super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                                ._M_impl.super__Vector_impl_data._M_start._0_4_)),
                                       pRVar5 + uVar9);
                  RationalNum::operator+=
                            ((RationalNum *)
                             (uVar15 * 0x10 +
                             CONCAT44(local_b8.
                                      super__Vector_base<RationalNum,_std::allocator<RationalNum>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                                      local_b8.
                                      super__Vector_base<RationalNum,_std::allocator<RationalNum>_>.
                                      _M_impl.super__Vector_impl_data._M_start._0_4_)),&local_98);
                }
                uVar11 = uVar9 & 0xffffffff;
                uVar9 = uVar9 + 1;
              } while ((uint)uVar9 != size);
            }
            local_50 = RationalNum::operator-
                                 ((RationalNum *)
                                  (CONCAT44(local_b8.
                                            super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                            local_b8.
                                            super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                            ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                  uVar15 * 0x10));
            local_98 = operator/(&local_50,pRVar5 + uVar15);
            RationalNum::operator=
                      ((RationalNum *)
                       (uVar15 * 0x10 +
                       CONCAT44(local_b8.
                                super__Vector_base<RationalNum,_std::allocator<RationalNum>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_b8.
                                super__Vector_base<RationalNum,_std::allocator<RationalNum>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_)),&local_98);
            uVar14 = local_88;
LAB_0011586b:
            uVar14 = uVar14 + 1;
            if (uVar14 == __n) {
              std::
              _Rb_tree<std::vector<RationalNum,std::allocator<RationalNum>>,std::vector<RationalNum,std::allocator<RationalNum>>,std::_Identity<std::vector<RationalNum,std::allocator<RationalNum>>>,std::less<std::vector<RationalNum,std::allocator<RationalNum>>>,std::allocator<std::vector<RationalNum,std::allocator<RationalNum>>>>
              ::_M_insert_unique<std::vector<RationalNum,std::allocator<RationalNum>>const&>
                        ((_Rb_tree<std::vector<RationalNum,std::allocator<RationalNum>>,std::vector<RationalNum,std::allocator<RationalNum>>,std::_Identity<std::vector<RationalNum,std::allocator<RationalNum>>>,std::less<std::vector<RationalNum,std::allocator<RationalNum>>>,std::allocator<std::vector<RationalNum,std::allocator<RationalNum>>>>
                          *)__return_storage_ptr__,&local_b8);
              uVar9 = local_a0;
              pvVar2 = (void *)CONCAT44(local_b8.
                                        super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                        local_b8.
                                        super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_4_);
              if (pvVar2 != (void *)0x0) {
                operator_delete(pvVar2,(long)local_b8.
                                             super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                       (long)pvVar2);
              }
              goto LAB_001158aa;
            }
          } while( true );
        }
        do {
          p_Var7 = p_Var3;
          p_Var8 = p_Var12;
          uVar14 = (ulong)p_Var7[1]._M_color;
          p_Var12 = p_Var7;
          if (uVar14 < uVar9) {
            p_Var12 = p_Var8;
          }
          p_Var3 = (&p_Var7->_M_left)[uVar14 < uVar9];
        } while ((&p_Var7->_M_left)[uVar14 < uVar9] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var12 == p_Var16) goto LAB_001156cf;
        if (uVar14 < uVar9) {
          p_Var7 = p_Var8;
        }
        if (uVar9 < p_Var7[1]._M_color) goto LAB_001156cf;
LAB_001158aa:
        uVar9 = uVar9 + 1;
      } while (uVar9 != __n);
      if (size != 0) {
        uVar9 = 0;
        do {
          if (ppRVar6[uVar9] != (RationalNum *)0x0) {
            operator_delete__(ppRVar6[uVar9]);
          }
          if (matrix_00[uVar9] != (RationalNum *)0x0) {
            operator_delete__(matrix_00[uVar9]);
          }
          uVar9 = uVar9 + 1;
        } while (__n != uVar9);
      }
    }
  }
  operator_delete__(ppRVar6);
  operator_delete__(matrix_00);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_80);
  return __return_storage_ptr__;
code_r0x0011574a:
  uVar11 = uVar11 + 1;
  uVar9 = uVar9 + 1;
  if (uVar11 == __n) goto LAB_0011586b;
  goto LAB_00115725;
}

Assistant:

set<vector<RationalNum>> getEigenSpaceBasis(RationalNum** matrix, unsigned int size, RationalNum eigenValue) {
    RationalNum** editedMatrix = new RationalNum* [size];
    for(int i = 0; i < size; i++) {
        editedMatrix[i] = new RationalNum [size];
        for(int j = 0; j < size; j++) editedMatrix[i][j] = matrix[i][j];
    }
    for(int i = 0; i < size; i++) editedMatrix[i][i] -= eigenValue;

    RationalNum** gaussForm = getGaussForm(editedMatrix, size);
    set<vector<RationalNum>> basis;

    set<unsigned int> basisFields;
    for(int i = 0; i < size; i++) {
        for(int j = 0; j < size; j++) {
            if(gaussForm[i][j] != 0ll) {
                basisFields.insert(j);
                break;
            }
        }
    }
    for(unsigned int k = 0; k < size; k++) {
        if(basisFields.find(k) != basisFields.end()) continue;
        vector<RationalNum> basisVector(size);
        basisVector[k] = 1ll;
        for(int i = 0; i < size; i++) {
            int cur = size;
            for(int j = 0; j < size; j++) {
                if(gaussForm[size - i - 1][j] != 0ll) {
                    cur = j;
                    break;
                }
            }
            if(cur == size) continue;
            for(int j = cur + 1; j < size; j++) {
                if(basisFields.find(j) != basisFields.end() || j == k) basisVector[cur] += basisVector[j] * gaussForm[size - i - 1][j];
            }
            basisVector[cur] = -basisVector[cur] / gaussForm[size - i - 1][cur];
        }
        basis.insert(basisVector);
    }

    for(int i = 0; i < size; i++) {
        delete[] gaussForm[i];
        delete[] editedMatrix[i];
    }
    delete[] gaussForm;
    delete[] editedMatrix;

    return basis;
}